

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O0

void anon_unknown.dwarf_d28b::printLogs(void)

{
  int iVar1;
  TextOutputStream *unaff_retaddr;
  TextOutputStream *in_stack_ffffffffffffff70;
  undefined1 local_59 [56];
  allocator local_21;
  string local_20 [8];
  string *in_stack_ffffffffffffffe8;
  string *in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  if ((anonymous_namespace)::printLogs()::textlog == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::printLogs()::textlog);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,"%S [%d] %m\n",&local_21);
      in_stack_ffffffffffffff70 = (TextOutputStream *)local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_59 + 1),"%Y-%m-%d %H:%M:%S.%N",
                 (allocator *)in_stack_ffffffffffffff70);
      binlog::TextOutputStream::TextOutputStream
                (unaff_retaddr,(ostream *)in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                 in_stack_ffffffffffffffe8);
      std::__cxx11::string::~string((string *)(local_59 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_59);
      std::__cxx11::string::~string(local_20);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(binlog::TextOutputStream::~TextOutputStream,&printLogs::textlog,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::printLogs()::textlog);
    }
  }
  binlog::consume<binlog::TextOutputStream>(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void printLogs()
{
  static binlog::TextOutputStream textlog(std::cerr, "%S [%d] %m\n");
  binlog::consume(textlog);
}